

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

void __thiscall QTextEdit::inputMethodEvent(QTextEdit *this,QInputMethodEvent *e)

{
  long lVar1;
  QWidgetTextControl *this_00;
  LayoutDirection LVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  QPointF local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  this_00 = *(QWidgetTextControl **)(lVar1 + 0x2f8);
  LVar2 = QWidget::layoutDirection(*(QWidget **)(lVar1 + 8));
  if (LVar2 == RightToLeft) {
    iVar3 = QAbstractSlider::maximum(*(QAbstractSlider **)(lVar1 + 0x288));
    iVar4 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x288));
    iVar3 = iVar3 - iVar4;
  }
  else {
    iVar3 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x288));
  }
  iVar4 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x290));
  local_40.yp = (qreal)iVar4;
  local_40.xp = (double)iVar3;
  QWidgetTextControl::processEvent(this_00,(QEvent *)e,&local_40,*(QWidget **)(lVar1 + 0x2b0));
  if (((*(long *)(e + 0x20) != 0) || (*(long *)(e + 0x38) != 0)) || (*(long *)(e + 0x50) != 0)) {
    (**(code **)(**(long **)(*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.
                                       field_0x8 + 0x2f8) + 0x60))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::inputMethodEvent(QInputMethodEvent *e)
{
    Q_D(QTextEdit);
#ifdef QT_KEYPAD_NAVIGATION
    if (d->control->textInteractionFlags() & Qt::TextEditable
        && QApplicationPrivate::keypadNavigationEnabled()
        && !hasEditFocus())
        setEditFocus(true);
#endif
    d->sendControlEvent(e);
    const bool emptyEvent = e->preeditString().isEmpty() && e->commitString().isEmpty()
                         && e->attributes().isEmpty();
    if (emptyEvent)
        return;
    ensureCursorVisible();
}